

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall
TasGrid::GridWavelet::evaluateGpuMixed(GridWavelet *this,double *x,int num_x,double *y)

{
  AccelerationContext *acceleration;
  int iVar1;
  int K;
  double *pdVar2;
  pointer A;
  undefined1 local_50 [8];
  Data2D<double> weights;
  double *y_local;
  int num_x_local;
  double *x_local;
  GridWavelet *this_local;
  
  weights.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = y;
  loadGpuCoefficients<double>(this);
  iVar1 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  Data2D<double>::Data2D<int,int>((Data2D<double> *)local_50,iVar1,num_x);
  pdVar2 = Data2D<double>::getStrip((Data2D<double> *)local_50,0);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x20])(this,x,(ulong)(uint)num_x,pdVar2)
  ;
  acceleration = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
  K = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  A = ::std::
      unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
      ::operator->(&this->gpu_cache);
  pdVar2 = Data2D<double>::data((Data2D<double> *)local_50);
  TasGpu::denseMultiplyMixed<double>
            (acceleration,iVar1,num_x,K,1.0,&A->coefficients,pdVar2,0.0,
             weights.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  Data2D<double>::~Data2D((Data2D<double> *)local_50);
  return;
}

Assistant:

void GridWavelet::evaluateGpuMixed(const double x[], int num_x, double y[]) const{
    loadGpuCoefficients<double>();

    Data2D<double> weights(points.getNumIndexes(), num_x);
    evaluateHierarchicalFunctions(x, num_x, weights.getStrip(0));

    TasGpu::denseMultiplyMixed(acceleration, num_outputs, num_x, points.getNumIndexes(), 1.0, gpu_cache->coefficients, weights.data(), 0.0, y);
}